

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O2

void MutableS2ShapeIndex::GetBatchSizes
               (int num_items,int max_batches,double final_bytes_per_item,double tmp_bytes_per_item,
               double tmp_memory_budget_bytes,vector<int,_std::allocator<int>_> *batch_sizes)

{
  pointer piVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double __x;
  int batch_items;
  ostream *local_30;
  
  __x = 1.0 - final_bytes_per_item / tmp_bytes_per_item;
  dVar4 = tmp_memory_budget_bytes + (double)num_items * final_bytes_per_item;
  dVar3 = pow(__x,(double)max_batches);
  dVar3 = ((double)num_items * final_bytes_per_item) / (1.0 - dVar3);
  if (dVar3 <= dVar4) {
    dVar3 = dVar4;
  }
  piVar1 = (batch_sizes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((batch_sizes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (batch_sizes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  dVar3 = dVar3 / tmp_bytes_per_item;
  iVar2 = 1;
  for (; (iVar2 < max_batches && (0 < num_items)); num_items = num_items - batch_items) {
    batch_items = (int)(dVar3 + 1.0);
    if (num_items < (int)(dVar3 + 1.0)) {
      batch_items = num_items;
    }
    std::vector<int,_std::allocator<int>_>::push_back(batch_sizes,&batch_items);
    dVar3 = dVar3 * __x;
    iVar2 = iVar2 + 1;
  }
  if ((ulong)((long)(batch_sizes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(batch_sizes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2) <= (ulong)(long)max_batches) {
    return;
  }
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)&batch_items,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.cc"
             ,0x2c5,kFatal,(ostream *)&std::cerr);
  std::operator<<(local_30,"Check failed: (batch_sizes->size()) <= (max_batches) ");
  abort();
}

Assistant:

void MutableS2ShapeIndex::GetBatchSizes(int num_items, int max_batches,
                                        double final_bytes_per_item,
                                        double tmp_bytes_per_item,
                                        double tmp_memory_budget_bytes,
                                        vector<int>* batch_sizes) {
  // This code tries to fit all the data into the same memory space
  // ("total_budget_bytes") at every iteration.  The data consists of some
  // number of processed items (at "final_bytes_per_item" each), plus some
  // number being updated (at "tmp_bytes_per_item" each).  The space occupied
  // by the items being updated is the "free space".  At each iteration, the
  // free space is multiplied by (1 - final_bytes_per_item/tmp_bytes_per_item)
  // as the items are converted into their final form.
  double final_bytes = num_items * final_bytes_per_item;
  double final_bytes_ratio = final_bytes_per_item / tmp_bytes_per_item;
  double free_space_multiplier = 1 - final_bytes_ratio;

  // The total memory budget is the greater of the final size plus the allowed
  // temporary memory, or the minimum amount of memory required to limit the
  // number of batches to "max_batches".
  double total_budget_bytes = max(
      final_bytes + tmp_memory_budget_bytes,
      final_bytes / (1 - pow(free_space_multiplier, max_batches)));

  // "max_batch_items" is the number of items in the current batch.
  double max_batch_items = total_budget_bytes / tmp_bytes_per_item;
  batch_sizes->clear();
  for (int i = 0; i + 1 < max_batches && num_items > 0; ++i) {
    int batch_items =
        std::min(num_items, static_cast<int>(max_batch_items + 1));
    batch_sizes->push_back(batch_items);
    num_items -= batch_items;
    max_batch_items *= free_space_multiplier;
  }
  S2_DCHECK_LE(batch_sizes->size(), max_batches);
}